

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O0

bool __thiscall winmd::reader::filter::includes(filter *this,TypeDef *type)

{
  bool bVar1;
  string_view local_38;
  string_view local_28;
  TypeDef *local_18;
  TypeDef *type_local;
  filter *this_local;
  
  local_18 = type;
  type_local = (TypeDef *)this;
  local_28 = TypeDef::TypeNamespace(type);
  local_38 = TypeDef::TypeName(local_18);
  bVar1 = includes(this,&local_28,&local_38);
  return bVar1;
}

Assistant:

bool includes(TypeDef const& type) const
        {
            return includes(type.TypeNamespace(), type.TypeName());
        }